

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
const_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::const_validator(const_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                        *schema,uri *schema_location,string *custom_message,
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch)

{
  allocator<char> local_49;
  string local_48;
  
  *(undefined ***)&this->field_0xf0 = &PTR__validator_base_009a42b8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"const",&local_49);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::keyword_validator(&this->
                       super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ,&PTR_construction_vtable_24__009a6188,&local_48,schema,schema_location,
                      custom_message);
  std::__cxx11::string::~string((string *)&local_48);
  (this->
  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ).
  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  .super_validation_message_factory._vptr_validation_message_factory = (_func_int **)0x9a60c0;
  *(undefined8 *)&this->field_0xf0 = 0x9a6148;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             &(this->
              super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ).field_0xe0,sch);
  return;
}

Assistant:

const_validator(const Json& schema, const uri& schema_location, const std::string& custom_message, const Json& sch)
            : keyword_validator<Json>("const", schema, schema_location, custom_message), value_(sch)
        {
        }